

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

void __thiscall
andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long_const*>
          (Geometry<std::allocator<unsigned_long>> *this,
          __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          begin,__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                end,unsigned_long *it,CoordinateOrder *internalCoordinateOrder,
          allocator_type *allocator)

{
  size_t sVar1;
  unsigned_long *puVar2;
  size_t *psVar3;
  ulong uVar4;
  size_t j;
  long lVar5;
  ulong j_00;
  
  uVar4 = (long)end._M_current - (long)begin._M_current >> 3;
  puVar2 = __gnu_cxx::new_allocator<unsigned_long>::allocate
                     ((new_allocator<unsigned_long> *)this,uVar4 * 3,(void *)0x0);
  *(unsigned_long **)(this + 8) = puVar2;
  lVar5 = (long)end._M_current - (long)begin._M_current;
  *(long *)(this + 0x10) = (long)puVar2 + lVar5;
  *(long *)(this + 0x18) = lVar5 + (long)puVar2 + lVar5;
  *(ulong *)(this + 0x20) = uVar4;
  *(undefined8 *)(this + 0x28) = 1;
  *(CoordinateOrder *)(this + 0x30) = *internalCoordinateOrder;
  this[0x34] = (Geometry<std::allocator<unsigned_long>>)0x1;
  if (lVar5 != 0) {
    for (j_00 = 0; j_00 < uVar4; j_00 = j_00 + 1) {
      sVar1 = begin._M_current[j_00];
      psVar3 = Geometry<std::allocator<unsigned_long>_>::shape
                         ((Geometry<std::allocator<unsigned_long>_> *)this,j_00);
      *psVar3 = sVar1;
      *(size_t *)(this + 0x28) = sVar1 * *(long *)(this + 0x28);
      sVar1 = it[j_00];
      psVar3 = Geometry<std::allocator<unsigned_long>_>::strides
                         ((Geometry<std::allocator<unsigned_long>_> *)this,j_00);
      *psVar3 = sVar1;
      uVar4 = *(ulong *)(this + 0x20);
    }
    stridesFromShape<unsigned_long*,unsigned_long*>
              (*(unsigned_long **)(this + 8),*(unsigned_long **)(this + 8) + uVar4,
               *(unsigned_long **)(this + 0x10),internalCoordinateOrder);
    Geometry<std::allocator<unsigned_long>_>::updateSimplicity
              ((Geometry<std::allocator<unsigned_long>_> *)this);
    return;
  }
  return;
}

Assistant:

inline
Geometry<A>::Geometry
(
    ShapeIterator begin, 
    ShapeIterator end,
    StrideIterator it,
    const CoordinateOrder& internalCoordinateOrder,
    const typename Geometry<A>::allocator_type& allocator
)
: allocator_(allocator),
  shape_(allocator_.allocate(std::distance(begin, end) * 3)), 
  shapeStrides_(shape_ + std::distance(begin, end)),
  strides_(shapeStrides_ + std::distance(begin, end)), 
  dimension_(std::distance(begin, end)),
  size_(1),
  coordinateOrder_(internalCoordinateOrder),
  isSimple_(true)
{
    if(dimension() != 0) {
        for(std::size_t j=0; j<dimension(); ++j, ++begin, ++it) {
            const std::size_t s = static_cast<std::size_t>(*begin);
            shape(j) = s;
            size() *= s;
            strides(j) = *it;
        }
        stridesFromShape(shapeBegin(), shapeEnd(), shapeStridesBegin(), 
            internalCoordinateOrder);
        updateSimplicity();
    }
}